

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall
QPDF::checkHSharedObject
          (QPDF *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *idx_to_obj)

{
  int iVar1;
  bool bVar2;
  pointer pMVar3;
  const_reference this_00;
  reference this_01;
  size_type sVar4;
  mapped_type *pmVar5;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *this_02;
  size_t __n;
  string_view sVar6;
  string local_338;
  string local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string_view local_238;
  int local_224;
  int local_220;
  int h_length;
  int length;
  int nobjects;
  HSharedObjectEntry *se;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string_view local_170;
  qpdf_offset_t local_160;
  qpdf_offset_t h_offset;
  long local_150;
  qpdf_offset_t offset;
  string local_140;
  QPDFObjGen local_120;
  QPDFObjGen og;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string_view local_68;
  int local_54;
  undefined1 auStack_50 [4];
  int obj;
  key_type local_40;
  int local_3c;
  int i;
  int cur_object;
  HSharedObject *local_28;
  HSharedObject *so;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *idx_to_obj_local;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages_local;
  QPDF *this_local;
  
  so = (HSharedObject *)idx_to_obj;
  idx_to_obj_local =
       (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)pages;
  pages_local = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  local_28 = &pMVar3->shared_object_hints;
  if ((pMVar3->shared_object_hints).nshared_total < (pMVar3->shared_object_hints).nshared_first_page
     ) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&i,
               "shared object hint table: ntotal < nfirst_page");
    linearizationWarning(this,_i);
  }
  else {
    this_00 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                        ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                         idx_to_obj_local,0);
    local_3c = QPDFObjectHandle::getObjectID(this_00);
    for (local_40 = 0; local_40 < local_28->nshared_total; local_40 = local_40 + 1) {
      if (local_40 == local_28->nshared_first_page) {
        QTC::TC("qpdf","QPDF lin check shared past first page",0);
        pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        bVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::empty
                          (&pMVar3->part8);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_50,
                     "part 8 is empty but nshared_total > nshared_first_page");
          linearizationWarning(this,_auStack_50);
        }
        else {
          pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          this_01 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                              (&pMVar3->part8,0);
          local_54 = QPDFObjectHandle::getObjectID(this_01);
          if (local_54 != local_28->first_shared_obj) {
            std::__cxx11::to_string(&local_e8,local_28->first_shared_obj);
            std::operator+(&local_c8,"first shared object number mismatch: hint table = ",&local_e8)
            ;
            std::operator+(&local_a8,&local_c8,"; computed = ");
            std::__cxx11::to_string((string *)&og,local_54);
            std::operator+(&local_88,&local_a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og)
            ;
            sVar6 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_88);
            local_68 = sVar6;
            linearizationWarning(this,sVar6);
            std::__cxx11::string::~string((string *)&local_88);
            std::__cxx11::string::~string((string *)&og);
            std::__cxx11::string::~string((string *)&local_a8);
            std::__cxx11::string::~string((string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_e8);
          }
        }
        local_3c = local_28->first_shared_obj;
        QPDFObjGen::QPDFObjGen(&local_120,local_3c,0);
        pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        sVar4 = std::
                map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                ::count(&pMVar3->xref_table,&local_120);
        if (sVar4 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,"unknown object in shared object hint table",
                     (allocator<char> *)((long)&offset + 7));
          stopOnError(this,&local_140);
          std::__cxx11::string::~string((string *)&local_140);
          std::allocator<char>::~allocator((allocator<char> *)((long)&offset + 7));
        }
        h_offset._0_4_ = local_120.obj;
        h_offset._4_4_ = local_120.gen;
        local_150 = getLinearizationOffset(this,local_120);
        local_160 = adjusted_offset(this,local_28->first_shared_offset);
        if (local_150 != local_160) {
          std::__cxx11::to_string(&local_1f0,local_160);
          std::operator+(&local_1d0,"first shared object offset mismatch: hint table = ",&local_1f0)
          ;
          std::operator+(&local_1b0,&local_1d0,"; computed = ");
          std::__cxx11::to_string((string *)&se,local_150);
          std::operator+(&local_190,&local_1b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&se);
          sVar6 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_190);
          local_170 = sVar6;
          linearizationWarning(this,sVar6);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&se);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1f0);
        }
      }
      iVar1 = local_3c;
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)so,&local_40);
      *pmVar5 = iVar1;
      this_02 = &local_28->entries;
      __n = toS<int>(&local_40);
      _length = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                          (this_02,__n);
      h_length = _length->nobjects_minus_one + 1;
      local_220 = lengthNextN(this,local_3c,h_length);
      local_224 = local_28->min_group_length + _length->delta_group_length;
      if (local_220 != local_224) {
        std::__cxx11::to_string(&local_2f8,local_40);
        std::operator+(&local_2d8,"shared object ",&local_2f8);
        std::operator+(&local_2b8,&local_2d8," length mismatch: hint table = ");
        std::__cxx11::to_string(&local_318,local_224);
        std::operator+(&local_298,&local_2b8,&local_318);
        std::operator+(&local_278,&local_298,"; computed = ");
        std::__cxx11::to_string(&local_338,local_220);
        std::operator+(&local_258,&local_278,&local_338);
        sVar6 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_258);
        local_238 = sVar6;
        linearizationWarning(this,sVar6);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2f8);
      }
      local_3c = h_length + local_3c;
    }
  }
  return;
}

Assistant:

void
QPDF::checkHSharedObject(std::vector<QPDFObjectHandle> const& pages, std::map<int, int>& idx_to_obj)
{
    // Implementation note 125 says shared object groups always contain only one object.
    // Implementation note 128 says that Acrobat always nbits_nobjects to zero.  Implementation note
    // 130 says that Acrobat does not support more than one shared object per group.  These are all
    // consistent.

    // Implementation note 129 states that MD5 signatures are not implemented in Acrobat, so
    // signature_present must always be zero.

    // Implementation note 131 states that first_shared_obj and first_shared_offset have meaningless
    // values for single-page files.

    // Empirically, Acrobat and pdlin generate incorrect values for these whenever there are no
    // shared objects not referenced by the first page (i.e., nshared_total == nshared_first_page).

    HSharedObject& so = m->shared_object_hints;
    if (so.nshared_total < so.nshared_first_page) {
        linearizationWarning("shared object hint table: ntotal < nfirst_page");
    } else {
        // The first nshared_first_page objects are consecutive objects starting with the first page
        // object.  The rest are consecutive starting from the first_shared_obj object.
        int cur_object = pages.at(0).getObjectID();
        for (int i = 0; i < so.nshared_total; ++i) {
            if (i == so.nshared_first_page) {
                QTC::TC("qpdf", "QPDF lin check shared past first page");
                if (m->part8.empty()) {
                    linearizationWarning("part 8 is empty but nshared_total > nshared_first_page");
                } else {
                    int obj = m->part8.at(0).getObjectID();
                    if (obj != so.first_shared_obj) {
                        linearizationWarning(
                            "first shared object number mismatch: hint table = " +
                            std::to_string(so.first_shared_obj) +
                            "; computed = " + std::to_string(obj));
                    }
                }

                cur_object = so.first_shared_obj;

                QPDFObjGen og(cur_object, 0);
                if (m->xref_table.count(og) == 0) {
                    stopOnError("unknown object in shared object hint table");
                }
                qpdf_offset_t offset = getLinearizationOffset(og);
                qpdf_offset_t h_offset = adjusted_offset(so.first_shared_offset);
                if (offset != h_offset) {
                    linearizationWarning(
                        "first shared object offset mismatch: hint table = " +
                        std::to_string(h_offset) + "; computed = " + std::to_string(offset));
                }
            }

            idx_to_obj[i] = cur_object;
            HSharedObjectEntry& se = so.entries.at(toS(i));
            int nobjects = se.nobjects_minus_one + 1;
            int length = lengthNextN(cur_object, nobjects);
            int h_length = so.min_group_length + se.delta_group_length;
            if (length != h_length) {
                linearizationWarning(
                    "shared object " + std::to_string(i) + " length mismatch: hint table = " +
                    std::to_string(h_length) + "; computed = " + std::to_string(length));
            }
            cur_object += nobjects;
        }
    }
}